

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcolor.cpp
# Opt level: O0

void draw_colors(Am_Drawonable *d)

{
  Am_Drawonable *d_local;
  
  (**(code **)(*(long *)d + 0x160))(d,&black,&red,0xa0,10,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&plum,&green,0xa0,0x6e,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&orange,&blue,0xa0,0xd2,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&grey,&white,0xa0,0x136,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&orange,&black,0xa0,0x19a,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&black,&orange,0x1e,10,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&black,&orchid,0x1e,0x6e,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&black,&purple,0x1e,0xd2,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&black4,&grey,0x1e,0x136,100,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&black,&plum,0x1e,0x19a,100,0x37,0);
  (**(code **)(*(long *)d + 0xa0))();
  return;
}

Assistant:

void
draw_colors(Am_Drawonable *d)
{

  // Right column
  d->Draw_Rectangle(black, red, 160, 10, 100, 55);
  d->Draw_Rectangle(plum, green, 160, 110, 100, 55);
  d->Draw_Rectangle(orange, blue, 160, 210, 100, 55);
  d->Draw_Rectangle(grey, white, 160, 310, 100, 55);
  d->Draw_Rectangle(orange, black, 160, 410, 100, 55);

  // Left column
  d->Draw_Rectangle(black, orange, 30, 10, 100, 55);
  d->Draw_Rectangle(black, orchid, 30, 110, 100, 55);
  d->Draw_Rectangle(black, purple, 30, 210, 100, 55);
  d->Draw_Rectangle(black4, grey, 30, 310, 100, 55);
  d->Draw_Rectangle(black, plum, 30, 410, 100, 55);

  d->Flush_Output();
}